

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O3

void __thiscall CppUnit::TestPath::insert(TestPath *this,Test *test,int index)

{
  int iVar1;
  out_of_range *this_00;
  ulong uVar2;
  ulong uVar3;
  const_iterator local_60;
  iterator local_40;
  Test *local_20;
  Test *test_local;
  
  local_20 = test;
  if (index < 0) {
LAB_0012abfd:
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"TestPath::insert(): index out of range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar1 = (*this->_vptr_TestPath[10])();
  if (iVar1 < index) goto LAB_0012abfd;
  local_60._M_cur =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_60._M_first =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_60._M_node =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar2 = ((long)local_60._M_cur - (long)local_60._M_first >> 3) + (ulong)(uint)index;
  if ((long)uVar2 < 0) {
    uVar3 = (long)uVar2 >> 6;
  }
  else {
    if (uVar2 < 0x40) {
      local_60._M_last =
           (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_60._M_cur = local_60._M_cur + (uint)index;
      goto LAB_0012abcd;
    }
    uVar3 = uVar2 >> 6;
  }
  local_60._M_node = local_60._M_node + uVar3;
  local_60._M_first = *local_60._M_node;
  local_60._M_last = local_60._M_first + 0x40;
  local_60._M_cur = local_60._M_first + uVar2 + uVar3 * -0x40;
LAB_0012abcd:
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::insert
            (&local_40,&this->m_tests,&local_60,&local_20);
  return;
}

Assistant:

void 
TestPath::insert( Test *test, 
                  int index )
{
  if ( index < 0  ||  index > getTestCount() )
    throw std::out_of_range( "TestPath::insert(): index out of range" );
  m_tests.insert( m_tests.begin() + index, test );
}